

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiID IVar1;
  ImGuiWindow *window;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  ImGuiContext *g;
  uint uVar8;
  bool bVar9;
  float fVar10;
  
  pIVar4 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if (((uint)flags >> 8 & 1) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    IVar1 = pIVar4->ActiveId;
    if (IVar1 == id) {
      pIVar4->ActiveIdIsJustActivated = IVar1 != 0;
      if (IVar1 != 0) {
        pIVar4->ActiveIdTimer = 0.0;
      }
      pIVar4->ActiveId = 0;
      pIVar4->ActiveIdAllowNavDirFlags = 0;
      pIVar4->ActiveIdAllowOverlap = false;
      pIVar4->ActiveIdWindow = (ImGuiWindow *)0x0;
      return false;
    }
    return false;
  }
  uVar8 = flags | 2;
  if ((flags & 0x1eU) != 0) {
    uVar8 = flags;
  }
  pIVar2 = pIVar4->HoveredWindow;
  if (((uVar8 & 0x20) != 0) && (pIVar4->HoveredRootWindow == window)) {
    pIVar4->HoveredWindow = window;
  }
  bVar6 = ItemHoverable(bb,id);
  if ((((uVar8 >> 0xc & 1) == 0) || (pIVar4->DragDropActive != true)) ||
     ((pIVar4->DragDropSourceFlags & 4) != 0)) {
LAB_0014d9b9:
    bVar7 = false;
  }
  else {
    bVar7 = IsItemHovered(0x20);
    pIVar5 = GImGui;
    if (bVar7) {
      GImGui->HoveredId = id;
      pIVar5->HoveredIdAllowOverlap = false;
      fVar10 = 0.0;
      if ((id != 0) && (pIVar5->HoveredIdPreviousFrame == id)) {
        fVar10 = pIVar5->HoveredIdTimer + (pIVar5->IO).DeltaTime;
      }
      pIVar5->HoveredIdTimer = fVar10;
      fVar10 = pIVar4->HoveredIdTimer + 0.0001;
      if (((fVar10 != 0.0) || (NAN(fVar10))) &&
         ((bVar6 = true, fVar10 <= 0.01 ||
          ((int)((fVar10 + -0.01) / 0.7) <= (int)(((fVar10 - (pIVar4->IO).DeltaTime) + -0.01) / 0.7)
          )))) goto LAB_0014d9b9;
      FocusWindow(window);
      bVar7 = true;
      bVar6 = true;
    }
    else {
      bVar7 = false;
    }
  }
  if (((uVar8 & 0x20) != 0) && (pIVar4->HoveredRootWindow == window)) {
    pIVar4->HoveredWindow = pIVar2;
  }
  if (bVar6 == true && (uVar8 & 0x40) != 0) {
    bVar6 = (bool)(bVar6 & (pIVar4->HoveredIdPreviousFrame == 0 ||
                           pIVar4->HoveredIdPreviousFrame == id));
  }
  if (bVar6 != false) {
    if (((uVar8 >> 10 & 1) == 0) ||
       ((((pIVar4->IO).KeyCtrl == false && ((pIVar4->IO).KeyShift == false)) &&
        ((pIVar4->IO).KeyAlt == false)))) {
      if (((uVar8 & 2) != 0) && ((pIVar4->IO).MouseClicked[0] == true)) {
        SetActiveID(id,window);
        if ((uVar8 >> 0xd & 1) == 0) {
          SetFocusID(id,window);
        }
        FocusWindow(window);
      }
      pIVar5 = GImGui;
      if ((((uVar8 & 4) != 0) && ((pIVar4->IO).MouseClicked[0] != false)) ||
         (((uVar8 & 0x10) != 0 && ((pIVar4->IO).MouseDoubleClicked[0] == true)))) {
        if ((uVar8 >> 0xb & 1) == 0) {
          SetActiveID(id,window);
        }
        else {
          bVar7 = GImGui->ActiveId != 0;
          GImGui->ActiveIdIsJustActivated = bVar7;
          if (bVar7) {
            pIVar5->ActiveIdTimer = 0.0;
          }
          pIVar5->ActiveId = 0;
          pIVar5->ActiveIdAllowNavDirFlags = 0;
          pIVar5->ActiveIdAllowOverlap = false;
          pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
        }
        FocusWindow(window);
        bVar7 = true;
      }
      pIVar5 = GImGui;
      if (((uVar8 & 8) != 0) && ((pIVar4->IO).MouseReleased[0] == true)) {
        if (((uVar8 & 1) == 0) ||
           ((pIVar4->IO).MouseDownDurationPrev[0] < (pIVar4->IO).KeyRepeatDelay)) {
          bVar7 = true;
        }
        bVar9 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar9;
        if (bVar9) {
          pIVar5->ActiveIdTimer = 0.0;
        }
        pIVar5->ActiveId = 0;
        pIVar5->ActiveIdAllowNavDirFlags = 0;
        pIVar5->ActiveIdAllowOverlap = false;
        pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      if (((((uVar8 & 1) != 0) && (pIVar4->ActiveId == id)) &&
          (0.0 < (pIVar4->IO).MouseDownDuration[0])) && (bVar9 = IsMouseClicked(0,true), bVar9)) {
        bVar7 = true;
      }
    }
    if (bVar7) {
      pIVar4->NavDisableHighlight = true;
    }
  }
  if (((pIVar4->NavId == id) && (pIVar4->NavDisableHighlight == false)) &&
     ((pIVar4->NavDisableMouseHover == true &&
      ((IVar1 = pIVar4->ActiveId, IVar1 == id || IVar1 == 0 || (IVar1 == window->MoveId)))))) {
    bVar6 = true;
  }
  if (pIVar4->NavActivateDownId == id) {
    IVar1 = pIVar4->NavActivateId;
    fVar10 = GetNavInputAmount(0,(uVar8 & 1) * 2 + ImGuiInputReadMode_Pressed);
    bVar9 = true;
    if ((0.0 < fVar10 || IVar1 == id) || (bVar9 = bVar7, pIVar4->ActiveId == id)) {
      bVar7 = bVar9;
      pIVar4->NavActivateId = id;
      SetActiveID(id,window);
      if ((uVar8 >> 0xd & 1) == 0) {
        SetFocusID(id,window);
      }
      pIVar4->ActiveIdAllowNavDirFlags = 0xf;
    }
  }
  pIVar5 = GImGui;
  if (pIVar4->ActiveId == id) {
    if (pIVar4->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar4->NavActivateDownId != id) {
        bVar9 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar9;
        if (bVar9) {
          pIVar5->ActiveIdTimer = 0.0;
        }
        bVar9 = false;
        pIVar5->ActiveId = 0;
        pIVar5->ActiveIdAllowNavDirFlags = 0;
        pIVar5->ActiveIdAllowOverlap = false;
        pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
        goto LAB_0014dda8;
      }
    }
    else if (pIVar4->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        IVar3.y = (pIVar4->IO).MousePos.y - (bb->Min).y;
        IVar3.x = (pIVar4->IO).MousePos.x - (bb->Min).x;
        pIVar4->ActiveIdClickOffset = IVar3;
      }
      pIVar5 = GImGui;
      bVar9 = true;
      if ((pIVar4->IO).MouseDown[0] == false) {
        bVar9 = bVar7;
        if ((bVar6 == true && (uVar8 & 2) != 0) &&
           ((((uVar8 & 1) == 0 ||
             ((pIVar4->IO).MouseDownDurationPrev[0] < (pIVar4->IO).KeyRepeatDelay)) &&
            (bVar9 = true, pIVar4->DragDropActive != false)))) {
          bVar9 = bVar7;
        }
        bVar7 = bVar9;
        bVar9 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar9;
        if (bVar9) {
          pIVar5->ActiveIdTimer = 0.0;
        }
        bVar9 = false;
        pIVar5->ActiveId = 0;
        pIVar5->ActiveIdAllowNavDirFlags = 0;
        pIVar5->ActiveIdAllowOverlap = false;
        pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
      if ((uVar8 >> 0xd & 1) == 0) {
        pIVar4->NavDisableHighlight = true;
      }
      goto LAB_0014dda8;
    }
  }
  bVar9 = false;
LAB_0014dda8:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar6;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar9;
  }
  return bVar7;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default behavior requires click+release on same spot
    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = window;

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if ((flags & ImGuiButtonFlags_PressedOnDragDropHold) && g.DragDropActive && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicPressedRepeatAmount(g.HoveredIdTimer + 0.0001f, g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, 0.01f, 0.70f)) // FIXME: Our formula for CalcTypematicPressedRepeatAmount() is fishy
            {
                pressed = true;
                FocusWindow(window);
            }
        }

    if ((flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            //                        | CLICKING        | HOLDING with ImGuiButtonFlags_Repeat
            // PressedOnClickRelease  |  <on release>*  |  <on repeat> <on repeat> .. (NOT on release)  <-- MOST COMMON! (*) only if both click/release were over bounds
            // PressedOnClick         |  <on click>     |  <on click> <on repeat> <on repeat> ..
            // PressedOnRelease       |  <on release>   |  <on repeat> <on repeat> .. (NOT on release)
            // PressedOnDoubleClick   |  <on dclick>    |  <on dclick> <on repeat> <on repeat> ..
            // FIXME-NAV: We don't honor those different behaviors.
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window);
                if (!(flags & ImGuiButtonFlags_NoNavFocus))
                    SetFocusID(id, window);
                FocusWindow(window);
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                if (flags & ImGuiButtonFlags_NoHoldingActiveID)
                    ClearActiveID();
                else
                    SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        hovered = true;

    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputPressed(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
            g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right) | (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            if (g.IO.MouseDown[0])
            {
                held = true;
            }
            else
            {
                if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease))
                    if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                        if (!g.DragDropActive)
                            pressed = true;
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}